

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O2

void RigidBodyDynamics::ForwardDynamicsContactsDirect
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,ConstraintSet *CS,
               VectorNd *QDDot)

{
  uint uVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  VectorNd *lambda;
  void *local_58 [2];
  VectorNd *local_48;
  ConstraintSet *local_40;
  
  lambda = QDDot;
  CalcContactSystemVariables(model,Q,QDot,Tau,CS);
  local_40 = CS + 0xc0;
  local_48 = Tau;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_58,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_48);
  SolveContactSystemDirect
            ((MatrixNd *)(CS + 0xa8),(MatrixNd *)(CS + 0xe0),(VectorNd *)local_58,
             (VectorNd *)(CS + 0xd0),(VectorNd *)(CS + 0x110),lambda,(MatrixNd *)(CS + 0xf8),
             (VectorNd *)(CS + 0x110),(VectorNd *)(CS + 0x120),(LinearSolver *)CS);
  free(local_58[0]);
  uVar1 = model->dof_count;
  lVar2 = *(long *)(CS + 0x120);
  pdVar3 = (QDDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
    pdVar3[uVar5] = *(double *)(lVar2 + uVar5 * 8);
  }
  uVar5 = *(ulong *)(CS + 0x70);
  lVar2 = *(long *)(CS + 0x78);
  lVar4 = *(long *)(CS + 0x120);
  for (uVar6 = 0; uVar6 < uVar5; uVar6 = uVar6 + 1) {
    *(ulong *)(lVar2 + (ulong)uVar6 * 8) =
         *(ulong *)(lVar4 + (ulong)(uVar1 + uVar6) * 8) ^ 0x8000000000000000;
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsContactsDirect (
		Model &model,
		const VectorNd &Q,
		const VectorNd &QDot,
		const VectorNd &Tau,
		ConstraintSet &CS,
		VectorNd &QDDot
		) {
	LOG << "-------- " << __func__ << " --------" << std::endl;

	CalcContactSystemVariables (model, Q, QDot, Tau, CS);

	SolveContactSystemDirect (CS.H, CS.G, Tau - CS.C, CS.gamma, QDDot, CS.force, CS.A, CS.b, CS.x, CS.linear_solver);

	// Copy back QDDot
	for (unsigned int i = 0; i < model.dof_count; i++)
		QDDot[i] = CS.x[i];

	// Copy back contact forces
	for (unsigned int i = 0; i < CS.size(); i++) {
		CS.force[i] = -CS.x[model.dof_count + i];
	}
}